

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O2

void __thiscall
QHeaderViewPrivate::saveCascadingSectionSize(QHeaderViewPrivate *this,int visual,int size)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  int local_28;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = size;
  local_24 = visual;
  bVar1 = QHash<int,_int>::contains(&this->cascadingSectionSize,&local_24);
  if (!bVar1) {
    QHash<int,int>::emplace<int_const&>
              ((QHash<int,int> *)&this->cascadingSectionSize,&local_24,&local_28);
    iVar2 = this->firstCascadingSection;
    if (local_24 <= this->firstCascadingSection) {
      iVar2 = local_24;
    }
    this->firstCascadingSection = iVar2;
    iVar2 = local_24;
    if (local_24 < this->lastCascadingSection) {
      iVar2 = this->lastCascadingSection;
    }
    this->lastCascadingSection = iVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void saveCascadingSectionSize(int visual, int size) {
        if (!cascadingSectionSize.contains(visual)) {
            cascadingSectionSize.insert(visual, size);
            firstCascadingSection = qMin(firstCascadingSection, visual);
            lastCascadingSection = qMax(lastCascadingSection, visual);
        }
    }